

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int PreprocessARGB(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,int rgb_stride,
                  WebPPicture *picture)

{
  int in_ECX;
  undefined8 in_RDX;
  int rgb_bit_depth;
  int unaff_EBP;
  undefined4 in_R8D;
  WebPPicture *in_R9;
  void *unaff_R13;
  int unaff_R14D;
  void *unaff_R15;
  void *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  SharpYuvConversionMatrix *in_stack_00000028;
  int ok;
  int in_stack_ffffffffffffff88;
  int iVar1;
  int iVar2;
  undefined4 in_stack_ffffffffffffff9c;
  int local_34;
  
  rgb_bit_depth = (int)((ulong)in_RDX >> 0x20);
  iVar1 = in_R9->width;
  iVar2 = in_R9->height;
  SharpYuvGetConversionMatrix(kSharpYuvMatrixWebp);
  local_34 = SharpYuvConvert(in_R9,(void *)CONCAT44(in_stack_ffffffffffffff9c,iVar2),
                             (void *)CONCAT44(iVar1,in_R8D),in_ECX,in_stack_ffffffffffffff88,
                             rgb_bit_depth,unaff_R13,unaff_R14D,unaff_R15,unaff_EBP,unaff_retaddr,
                             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020
                             ,in_stack_00000028);
  if (local_34 == 0) {
    local_34 = WebPEncodingSetError(in_R9,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return local_34;
}

Assistant:

static int PreprocessARGB(const uint8_t* r_ptr,
                          const uint8_t* g_ptr,
                          const uint8_t* b_ptr,
                          int step, int rgb_stride,
                          WebPPicture* const picture) {
  const int ok = SharpYuvConvert(
      r_ptr, g_ptr, b_ptr, step, rgb_stride, /*rgb_bit_depth=*/8,
      picture->y, picture->y_stride, picture->u, picture->uv_stride, picture->v,
      picture->uv_stride, /*yuv_bit_depth=*/8, picture->width,
      picture->height, SharpYuvGetConversionMatrix(kSharpYuvMatrixWebp));
  if (!ok) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}